

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeCompiler.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_astSequenceNode_primitiveCompileIntoBytecode
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  ulong uVar1;
  size_t i;
  ulong uVar2;
  ulong uVar3;
  sysbvm_tuple_t local_58;
  sysbvm_tuple_t sStack_50;
  sysbvm_stackFrameRecord_t local_48;
  undefined8 local_38;
  undefined1 *local_30;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  local_58 = 0;
  sStack_50 = 0;
  local_48.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_48.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_48._12_4_ = 0;
  local_38 = 2;
  local_30 = (undefined1 *)&local_58;
  sysbvm_stackFrame_pushRecord(&local_48);
  uVar3 = *(ulong *)(*arguments + 0x30);
  if (uVar3 != 0 && (uVar3 & 0xf) == 0) {
    sStack_50 = 0;
    if (7 < *(uint *)(uVar3 + 0xc)) {
      uVar3 = (ulong)(*(uint *)(uVar3 + 0xc) >> 3);
      goto LAB_00140754;
    }
  }
  sStack_50 = 0;
  sStack_50 = sysbvm_functionBytecodeAssembler_addLiteral
                        (context,*(sysbvm_functionBytecodeAssembler_t **)(arguments[1] + 0x10),0x2f)
  ;
  uVar3 = 0;
LAB_00140754:
  for (uVar2 = 0; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    uVar1 = *(ulong *)(*arguments + 0x30);
    if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
      local_58 = *(sysbvm_tuple_t *)(uVar1 + 0x10 + uVar2 * 8);
    }
    else {
      local_58 = 0;
    }
    sStack_50 = sysbvm_functionBytecodeDirectCompiler_compileASTNode
                          (context,(sysbvm_functionBytecodeDirectCompiler_t *)arguments[1],local_58)
    ;
  }
  sysbvm_stackFrame_popRecord(&local_48);
  return sStack_50;
}

Assistant:

static sysbvm_tuple_t sysbvm_astSequenceNode_primitiveCompileIntoBytecode(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_functionBytecodeDirectCompiler_t **compiler = (sysbvm_functionBytecodeDirectCompiler_t **)&arguments[1];

    sysbvm_astSequenceNode_t **sequenceNode = (sysbvm_astSequenceNode_t**)node;
    struct {
        sysbvm_tuple_t expressionNode;
        sysbvm_tuple_t result;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    size_t expressionCount = sysbvm_array_getSize((*sequenceNode)->expressions);
    gcFrame.result = SYSBVM_NULL_TUPLE;
    if(expressionCount == 0)
        gcFrame.result = sysbvm_functionBytecodeAssembler_addLiteral(context, (*compiler)->assembler, SYSBVM_VOID_TUPLE);

    for(size_t i = 0; i < expressionCount; ++i)
    {
        gcFrame.expressionNode = sysbvm_array_at((*sequenceNode)->expressions, i);
        gcFrame.result = sysbvm_functionBytecodeDirectCompiler_compileASTNode(context, *compiler, gcFrame.expressionNode);
    }

    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.result;
}